

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O0

string * __thiscall
CppGenerator::genFindUpperBound
          (CppGenerator *this,string *rel_name,string *attrName,size_t depth,bool parallel)

{
  string *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  byte in_R9B;
  string upperPointer;
  string depthString;
  string *returnString;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string local_1b40 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe4e0;
  CppGenerator *in_stack_ffffffffffffe4e8;
  string local_1b00 [32];
  string local_1ae0 [32];
  string local_1ac0 [32];
  string local_1aa0 [7];
  undefined1 in_stack_ffffffffffffe567;
  size_t in_stack_ffffffffffffe568;
  string *in_stack_ffffffffffffe570;
  CppGenerator *in_stack_ffffffffffffe578;
  string local_1a80 [32];
  string local_1a60 [32];
  string local_1a40 [32];
  string local_1a20 [32];
  string local_1a00 [32];
  string local_19e0 [32];
  string local_19c0 [32];
  string local_19a0 [32];
  string local_1980 [32];
  string local_1960 [32];
  string local_1940 [32];
  string local_1920 [32];
  string local_1900 [32];
  string local_18e0 [32];
  string local_18c0 [32];
  string local_18a0 [32];
  string local_1880 [32];
  string local_1860 [32];
  string local_1840 [32];
  string local_1820 [32];
  string local_1800 [32];
  string local_17e0 [32];
  string local_17c0 [32];
  string local_17a0 [32];
  string local_1780 [32];
  string local_1760 [32];
  string local_1740 [32];
  string local_1720 [32];
  string local_1700 [32];
  string local_16e0 [32];
  string local_16c0 [32];
  string local_16a0 [32];
  string local_1680 [32];
  string local_1660 [32];
  string local_1640 [32];
  string local_1620 [32];
  string local_1600 [32];
  string local_15e0 [32];
  string local_15c0 [32];
  string local_15a0 [32];
  string local_1580 [32];
  string local_1560 [32];
  string local_1540 [32];
  string local_1520 [32];
  string local_1500 [32];
  string local_14e0 [32];
  string local_14c0 [32];
  string local_14a0 [32];
  string local_1480 [32];
  string local_1460 [32];
  string local_1440 [32];
  string local_1420 [32];
  string local_1400 [32];
  string local_13e0 [32];
  string local_13c0 [32];
  string local_13a0 [32];
  string local_1380 [32];
  string local_1360 [32];
  string local_1340 [32];
  string local_1320 [32];
  string local_1300 [32];
  string local_12e0 [32];
  string local_12c0 [32];
  string local_12a0 [32];
  string local_1280 [32];
  string local_1260 [32];
  string local_1240 [32];
  string local_1220 [32];
  string local_1200 [32];
  string local_11e0 [32];
  string local_11c0 [32];
  string local_11a0 [32];
  string local_1180 [32];
  string local_1160 [32];
  string local_1140 [32];
  string local_1120 [32];
  string local_1100 [32];
  string local_10e0 [32];
  string local_10c0 [32];
  string local_10a0 [32];
  string local_1080 [32];
  string local_1060 [32];
  string local_1040 [32];
  string local_1020 [32];
  string local_1000 [32];
  string local_fe0 [32];
  string local_fc0 [32];
  string local_fa0 [32];
  string local_f80 [32];
  string local_f60 [32];
  string local_f40 [32];
  string local_f20 [32];
  string local_f00 [32];
  string local_ee0 [32];
  string local_ec0 [32];
  string local_ea0 [32];
  string local_e80 [32];
  string local_e60 [32];
  string local_e40 [32];
  string local_e20 [32];
  string local_e00 [32];
  string local_de0 [32];
  string local_dc0 [32];
  string local_da0 [32];
  string local_d80 [32];
  string local_d60 [32];
  string local_d40 [32];
  string local_d20 [32];
  string local_d00 [32];
  string local_ce0 [32];
  string local_cc0 [32];
  string local_ca0 [32];
  string local_c80 [32];
  string local_c60 [32];
  string local_c40 [32];
  string local_c20 [32];
  string local_c00 [32];
  string local_be0 [32];
  string local_bc0 [32];
  string local_ba0 [32];
  string local_b80 [32];
  string local_b60 [32];
  string local_b40 [32];
  string local_b20 [32];
  string local_b00 [32];
  string local_ae0 [32];
  string local_ac0 [32];
  string local_aa0 [32];
  string local_a80 [32];
  string local_a60 [32];
  string local_a40 [32];
  string local_a20 [32];
  string local_a00 [32];
  string local_9e0 [32];
  string local_9c0 [32];
  string local_9a0 [32];
  string local_980 [32];
  string local_960 [32];
  string local_940 [32];
  string local_920 [32];
  string local_900 [32];
  string local_8e0 [32];
  string local_8c0 [32];
  string local_8a0 [32];
  string local_880 [32];
  string local_860 [32];
  string local_840 [32];
  string local_820 [32];
  string local_800 [32];
  string local_7e0 [32];
  string local_7c0 [32];
  string local_7a0 [32];
  string local_780 [32];
  string local_760 [32];
  string local_740 [32];
  string local_720 [32];
  string local_700 [32];
  string local_6e0 [32];
  string local_6c0 [32];
  string local_6a0 [32];
  string local_680 [32];
  string local_660 [32];
  string local_640 [32];
  string local_620 [32];
  string local_600 [32];
  string local_5e0 [32];
  string local_5c0 [32];
  string local_5a0 [32];
  string local_580 [32];
  string local_560 [32];
  string local_540 [32];
  string local_520 [32];
  string local_500 [32];
  string local_4e0 [32];
  string local_4c0 [32];
  string local_4a0 [32];
  string local_480 [32];
  string local_460 [32];
  string local_440 [32];
  string local_420 [32];
  string local_400 [32];
  string local_3e0 [32];
  string local_3c0 [32];
  string local_3a0 [32];
  string local_380 [32];
  string local_360 [32];
  string local_340 [32];
  string local_320 [32];
  string local_300 [32];
  string local_2e0 [32];
  string local_2c0 [32];
  string local_2a0 [32];
  string local_280 [32];
  string local_260 [32];
  string local_240 [32];
  string local_220 [32];
  string local_200 [32];
  string local_1e0 [32];
  string local_1c0 [32];
  string local_1a0 [32];
  string local_180 [32];
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [35];
  undefined1 local_9d;
  string local_90 [32];
  string local_70 [32];
  string local_50 [39];
  byte local_29;
  string *local_18;
  
  local_29 = in_R9B & 1;
  __rhs = in_RDI;
  local_18 = in_RDX;
  std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffe4e8);
  std::__cxx11::string::string(local_90,local_18);
  getUpperPointer(in_stack_ffffffffffffe578,in_stack_ffffffffffffe570,in_stack_ffffffffffffe568,
                  (bool)in_stack_ffffffffffffe567);
  std::__cxx11::string::~string(local_90);
  local_9d = 0;
  offset_abi_cxx11_(in_stack_ffffffffffffe4e8,(size_t)in_stack_ffffffffffffe4e0);
  std::operator+(in_RSI,(char *)__rhs);
  std::operator+(in_RSI,__rhs);
  std::operator+(in_RSI,(char *)__rhs);
  std::operator+(in_RSI,__rhs);
  std::operator+(in_RSI,(char *)__rhs);
  std::operator+(in_RSI,__rhs);
  std::operator+(in_RSI,(char *)__rhs);
  std::operator+(in_RSI,__rhs);
  std::operator+(in_RSI,(char *)__rhs);
  std::operator+(in_RSI,__rhs);
  std::operator+(in_RSI,(char *)__rhs);
  offset_abi_cxx11_(in_stack_ffffffffffffe4e8,(size_t)in_stack_ffffffffffffe4e0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe4e8,in_stack_ffffffffffffe4e0);
  std::operator+(in_RSI,(char *)__rhs);
  offset_abi_cxx11_(in_stack_ffffffffffffe4e8,(size_t)in_stack_ffffffffffffe4e0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe4e8,in_stack_ffffffffffffe4e0);
  std::operator+(in_RSI,(char *)__rhs);
  std::operator+(in_RSI,__rhs);
  std::operator+(in_RSI,(char *)__rhs);
  std::operator+(in_RSI,__rhs);
  std::operator+(in_RSI,(char *)__rhs);
  std::operator+(in_RSI,(char *)__rhs);
  std::operator+(in_RSI,__rhs);
  std::operator+(in_RSI,(char *)__rhs);
  std::operator+(in_RSI,__rhs);
  std::operator+(in_RSI,(char *)__rhs);
  std::operator+(in_RSI,__rhs);
  std::operator+(in_RSI,(char *)__rhs);
  offset_abi_cxx11_(in_stack_ffffffffffffe4e8,(size_t)in_stack_ffffffffffffe4e0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe4e8,in_stack_ffffffffffffe4e0);
  std::operator+(in_RSI,(char *)__rhs);
  offset_abi_cxx11_(in_stack_ffffffffffffe4e8,(size_t)in_stack_ffffffffffffe4e0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe4e8,in_stack_ffffffffffffe4e0);
  std::operator+(in_RSI,(char *)__rhs);
  std::operator+(in_RSI,__rhs);
  std::operator+(in_RSI,(char *)__rhs);
  std::operator+(in_RSI,__rhs);
  std::operator+(in_RSI,(char *)__rhs);
  offset_abi_cxx11_(in_stack_ffffffffffffe4e8,(size_t)in_stack_ffffffffffffe4e0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe4e8,in_stack_ffffffffffffe4e0);
  std::operator+(in_RSI,(char *)__rhs);
  offset_abi_cxx11_(in_stack_ffffffffffffe4e8,(size_t)in_stack_ffffffffffffe4e0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe4e8,in_stack_ffffffffffffe4e0);
  std::operator+(in_RSI,(char *)__rhs);
  std::operator+(in_RSI,__rhs);
  std::operator+(in_RSI,(char *)__rhs);
  std::operator+(in_RSI,__rhs);
  std::operator+(in_RSI,(char *)__rhs);
  std::operator+(in_RSI,__rhs);
  std::operator+(in_RSI,(char *)__rhs);
  offset_abi_cxx11_(in_stack_ffffffffffffe4e8,(size_t)in_stack_ffffffffffffe4e0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe4e8,in_stack_ffffffffffffe4e0);
  std::operator+(in_RSI,(char *)__rhs);
  offset_abi_cxx11_(in_stack_ffffffffffffe4e8,(size_t)in_stack_ffffffffffffe4e0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe4e8,in_stack_ffffffffffffe4e0);
  std::operator+(in_RSI,(char *)__rhs);
  std::operator+(in_RSI,__rhs);
  std::operator+(in_RSI,(char *)__rhs);
  std::operator+(in_RSI,__rhs);
  std::operator+(in_RSI,(char *)__rhs);
  std::operator+(in_RSI,__rhs);
  std::operator+(in_RSI,(char *)__rhs);
  std::operator+(in_RSI,__rhs);
  std::operator+(in_RSI,(char *)__rhs);
  std::operator+(in_RSI,__rhs);
  std::operator+(in_RSI,(char *)__rhs);
  offset_abi_cxx11_(in_stack_ffffffffffffe4e8,(size_t)in_stack_ffffffffffffe4e0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe4e8,in_stack_ffffffffffffe4e0);
  std::operator+(in_RSI,(char *)__rhs);
  offset_abi_cxx11_(in_stack_ffffffffffffe4e8,(size_t)in_stack_ffffffffffffe4e0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe4e8,in_stack_ffffffffffffe4e0);
  std::operator+(in_RSI,(char *)__rhs);
  offset_abi_cxx11_(in_stack_ffffffffffffe4e8,(size_t)in_stack_ffffffffffffe4e0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe4e8,in_stack_ffffffffffffe4e0);
  std::operator+(in_RSI,(char *)__rhs);
  offset_abi_cxx11_(in_stack_ffffffffffffe4e8,(size_t)in_stack_ffffffffffffe4e0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe4e8,in_stack_ffffffffffffe4e0);
  std::operator+(in_RSI,(char *)__rhs);
  std::operator+(in_RSI,__rhs);
  std::operator+(in_RSI,(char *)__rhs);
  std::operator+(in_RSI,__rhs);
  std::operator+(in_RSI,(char *)__rhs);
  std::operator+(in_RSI,__rhs);
  std::operator+(in_RSI,(char *)__rhs);
  offset_abi_cxx11_(in_stack_ffffffffffffe4e8,(size_t)in_stack_ffffffffffffe4e0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe4e8,in_stack_ffffffffffffe4e0);
  std::operator+(in_RSI,(char *)__rhs);
  offset_abi_cxx11_(in_stack_ffffffffffffe4e8,(size_t)in_stack_ffffffffffffe4e0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe4e8,in_stack_ffffffffffffe4e0);
  std::operator+(in_RSI,(char *)__rhs);
  offset_abi_cxx11_(in_stack_ffffffffffffe4e8,(size_t)in_stack_ffffffffffffe4e0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe4e8,in_stack_ffffffffffffe4e0);
  std::operator+(in_RSI,(char *)__rhs);
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::~string(local_c40);
  std::__cxx11::string::~string(local_e0);
  std::__cxx11::string::~string(local_100);
  std::__cxx11::string::~string(local_c20);
  std::__cxx11::string::~string(local_120);
  std::__cxx11::string::~string(local_140);
  std::__cxx11::string::~string(local_c00);
  std::__cxx11::string::~string(local_160);
  std::__cxx11::string::~string(local_180);
  std::__cxx11::string::~string(local_1a0);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::string::~string(local_200);
  std::__cxx11::string::~string(local_220);
  std::__cxx11::string::~string(local_240);
  std::__cxx11::string::~string(local_be0);
  std::__cxx11::string::~string(local_260);
  std::__cxx11::string::~string(local_280);
  std::__cxx11::string::~string(local_bc0);
  std::__cxx11::string::~string(local_2a0);
  std::__cxx11::string::~string(local_2c0);
  std::__cxx11::string::~string(local_ba0);
  std::__cxx11::string::~string(local_2e0);
  std::__cxx11::string::~string(local_300);
  std::__cxx11::string::~string(local_b80);
  std::__cxx11::string::~string(local_320);
  std::__cxx11::string::~string(local_340);
  std::__cxx11::string::~string(local_360);
  std::__cxx11::string::~string(local_380);
  std::__cxx11::string::~string(local_3a0);
  std::__cxx11::string::~string(local_3c0);
  std::__cxx11::string::~string(local_3e0);
  std::__cxx11::string::~string(local_400);
  std::__cxx11::string::~string(local_420);
  std::__cxx11::string::~string(local_440);
  std::__cxx11::string::~string(local_460);
  std::__cxx11::string::~string(local_480);
  std::__cxx11::string::~string(local_b60);
  std::__cxx11::string::~string(local_4a0);
  std::__cxx11::string::~string(local_4c0);
  std::__cxx11::string::~string(local_b40);
  std::__cxx11::string::~string(local_4e0);
  std::__cxx11::string::~string(local_500);
  std::__cxx11::string::~string(local_520);
  std::__cxx11::string::~string(local_540);
  std::__cxx11::string::~string(local_560);
  std::__cxx11::string::~string(local_580);
  std::__cxx11::string::~string(local_5a0);
  std::__cxx11::string::~string(local_5c0);
  std::__cxx11::string::~string(local_b20);
  std::__cxx11::string::~string(local_5e0);
  std::__cxx11::string::~string(local_600);
  std::__cxx11::string::~string(local_b00);
  std::__cxx11::string::~string(local_620);
  std::__cxx11::string::~string(local_640);
  std::__cxx11::string::~string(local_660);
  std::__cxx11::string::~string(local_680);
  std::__cxx11::string::~string(local_6a0);
  std::__cxx11::string::~string(local_6c0);
  std::__cxx11::string::~string(local_ae0);
  std::__cxx11::string::~string(local_6e0);
  std::__cxx11::string::~string(local_700);
  std::__cxx11::string::~string(local_ac0);
  std::__cxx11::string::~string(local_720);
  std::__cxx11::string::~string(local_740);
  std::__cxx11::string::~string(local_760);
  std::__cxx11::string::~string(local_780);
  std::__cxx11::string::~string(local_7a0);
  std::__cxx11::string::~string(local_7c0);
  std::__cxx11::string::~string(local_7e0);
  std::__cxx11::string::~string(local_800);
  std::__cxx11::string::~string(local_820);
  std::__cxx11::string::~string(local_840);
  std::__cxx11::string::~string(local_860);
  std::__cxx11::string::~string(local_880);
  std::__cxx11::string::~string(local_8a0);
  std::__cxx11::string::~string(local_aa0);
  std::__cxx11::string::~string(local_8c0);
  std::__cxx11::string::~string(local_8e0);
  std::__cxx11::string::~string(local_a80);
  std::__cxx11::string::~string(local_900);
  std::__cxx11::string::~string(local_920);
  std::__cxx11::string::~string(local_940);
  std::__cxx11::string::~string(local_960);
  std::__cxx11::string::~string(local_980);
  std::__cxx11::string::~string(local_9a0);
  std::__cxx11::string::~string(local_9c0);
  std::__cxx11::string::~string(local_9e0);
  std::__cxx11::string::~string(local_a00);
  std::__cxx11::string::~string(local_a20);
  std::__cxx11::string::~string(local_a40);
  std::__cxx11::string::~string(local_a60);
  offset_abi_cxx11_(in_stack_ffffffffffffe4e8,(size_t)in_stack_ffffffffffffe4e0);
  std::operator+(in_RSI,(char *)__rhs);
  offset_abi_cxx11_(in_stack_ffffffffffffe4e8,(size_t)in_stack_ffffffffffffe4e0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe4e8,in_stack_ffffffffffffe4e0);
  std::operator+(in_RSI,(char *)__rhs);
  std::operator+(in_RSI,__rhs);
  std::operator+(in_RSI,(char *)__rhs);
  std::operator+(in_RSI,__rhs);
  std::operator+(in_RSI,(char *)__rhs);
  std::operator+(in_RSI,__rhs);
  std::operator+(in_RSI,(char *)__rhs);
  std::operator+(in_RSI,__rhs);
  std::operator+(in_RSI,(char *)__rhs);
  std::operator+(in_RSI,__rhs);
  std::operator+(in_RSI,(char *)__rhs);
  offset_abi_cxx11_(in_stack_ffffffffffffe4e8,(size_t)in_stack_ffffffffffffe4e0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe4e8,in_stack_ffffffffffffe4e0);
  std::operator+(in_RSI,(char *)__rhs);
  offset_abi_cxx11_(in_stack_ffffffffffffe4e8,(size_t)in_stack_ffffffffffffe4e0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe4e8,in_stack_ffffffffffffe4e0);
  std::operator+(in_RSI,(char *)__rhs);
  offset_abi_cxx11_(in_stack_ffffffffffffe4e8,(size_t)in_stack_ffffffffffffe4e0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe4e8,in_stack_ffffffffffffe4e0);
  std::operator+(in_RSI,(char *)__rhs);
  std::operator+(in_RSI,__rhs);
  std::operator+(in_RSI,(char *)__rhs);
  std::operator+(in_RSI,__rhs);
  std::operator+(in_RSI,(char *)__rhs);
  std::operator+(in_RSI,(char *)__rhs);
  std::operator+(in_RSI,__rhs);
  std::operator+(in_RSI,(char *)__rhs);
  std::operator+(in_RSI,__rhs);
  std::operator+(in_RSI,(char *)__rhs);
  offset_abi_cxx11_(in_stack_ffffffffffffe4e8,(size_t)in_stack_ffffffffffffe4e0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe4e8,in_stack_ffffffffffffe4e0);
  std::operator+(in_RSI,(char *)__rhs);
  offset_abi_cxx11_(in_stack_ffffffffffffe4e8,(size_t)in_stack_ffffffffffffe4e0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe4e8,in_stack_ffffffffffffe4e0);
  std::operator+(in_RSI,(char *)__rhs);
  offset_abi_cxx11_(in_stack_ffffffffffffe4e8,(size_t)in_stack_ffffffffffffe4e0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe4e8,in_stack_ffffffffffffe4e0);
  std::operator+(in_RSI,(char *)__rhs);
  offset_abi_cxx11_(in_stack_ffffffffffffe4e8,(size_t)in_stack_ffffffffffffe4e0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe4e8,in_stack_ffffffffffffe4e0);
  std::operator+(in_RSI,(char *)__rhs);
  std::operator+(in_RSI,__rhs);
  std::operator+(in_RSI,(char *)__rhs);
  std::operator+(in_RSI,__rhs);
  std::operator+(in_RSI,(char *)__rhs);
  std::operator+(in_RSI,__rhs);
  std::operator+(in_RSI,(char *)__rhs);
  std::operator+(in_RSI,(char *)__rhs);
  std::operator+(in_RSI,__rhs);
  std::operator+(in_RSI,(char *)__rhs);
  std::operator+(in_RSI,__rhs);
  std::operator+(in_RSI,(char *)__rhs);
  std::operator+(in_RSI,__rhs);
  std::operator+(in_RSI,(char *)__rhs);
  offset_abi_cxx11_(in_stack_ffffffffffffe4e8,(size_t)in_stack_ffffffffffffe4e0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe4e8,in_stack_ffffffffffffe4e0);
  std::operator+(in_RSI,(char *)__rhs);
  offset_abi_cxx11_(in_stack_ffffffffffffe4e8,(size_t)in_stack_ffffffffffffe4e0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe4e8,in_stack_ffffffffffffe4e0);
  std::operator+(in_RSI,(char *)__rhs);
  std::operator+(in_RSI,__rhs);
  std::operator+(in_RSI,(char *)__rhs);
  std::operator+(in_RSI,__rhs);
  std::operator+(in_RSI,(char *)__rhs);
  offset_abi_cxx11_(in_stack_ffffffffffffe4e8,(size_t)in_stack_ffffffffffffe4e0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe4e8,in_stack_ffffffffffffe4e0);
  std::operator+(in_RSI,(char *)__rhs);
  offset_abi_cxx11_(in_stack_ffffffffffffe4e8,(size_t)in_stack_ffffffffffffe4e0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe4e8,in_stack_ffffffffffffe4e0);
  std::operator+(in_RSI,(char *)__rhs);
  offset_abi_cxx11_(in_stack_ffffffffffffe4e8,(size_t)in_stack_ffffffffffffe4e0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe4e8,in_stack_ffffffffffffe4e0);
  std::operator+(in_RSI,(char *)__rhs);
  std::operator+(in_RSI,__rhs);
  std::operator+(in_RSI,(char *)__rhs);
  std::operator+(in_RSI,__rhs);
  std::operator+(in_RSI,(char *)__rhs);
  std::operator+(in_RSI,__rhs);
  std::operator+(in_RSI,(char *)__rhs);
  offset_abi_cxx11_(in_stack_ffffffffffffe4e8,(size_t)in_stack_ffffffffffffe4e0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe4e8,in_stack_ffffffffffffe4e0);
  std::operator+(in_RSI,(char *)__rhs);
  offset_abi_cxx11_(in_stack_ffffffffffffe4e8,(size_t)in_stack_ffffffffffffe4e0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe4e8,in_stack_ffffffffffffe4e0);
  std::operator+(in_RSI,(char *)__rhs);
  offset_abi_cxx11_(in_stack_ffffffffffffe4e8,(size_t)in_stack_ffffffffffffe4e0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe4e8,in_stack_ffffffffffffe4e0);
  std::operator+(in_RSI,(char *)__rhs);
  offset_abi_cxx11_(in_stack_ffffffffffffe4e8,(size_t)in_stack_ffffffffffffe4e0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe4e8,in_stack_ffffffffffffe4e0);
  std::operator+(in_RSI,(char *)__rhs);
  offset_abi_cxx11_(in_stack_ffffffffffffe4e8,(size_t)in_stack_ffffffffffffe4e0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe4e8,in_stack_ffffffffffffe4e0);
  std::operator+(in_RSI,(char *)__rhs);
  offset_abi_cxx11_(in_stack_ffffffffffffe4e8,(size_t)in_stack_ffffffffffffe4e0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe4e8,in_stack_ffffffffffffe4e0);
  std::operator+(in_RSI,(char *)__rhs);
  std::operator+(in_RSI,__rhs);
  std::operator+(in_RSI,(char *)__rhs);
  std::operator+(in_RSI,__rhs);
  std::operator+(in_RSI,(char *)__rhs);
  std::operator+(in_RSI,__rhs);
  std::operator+(in_RSI,(char *)__rhs);
  offset_abi_cxx11_(in_stack_ffffffffffffe4e8,(size_t)in_stack_ffffffffffffe4e0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe4e8,in_stack_ffffffffffffe4e0);
  std::operator+(in_RSI,(char *)__rhs);
  offset_abi_cxx11_(in_stack_ffffffffffffe4e8,(size_t)in_stack_ffffffffffffe4e0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe4e8,in_stack_ffffffffffffe4e0);
  std::operator+(in_RSI,(char *)__rhs);
  std::operator+(in_RSI,__rhs);
  std::operator+(in_RSI,(char *)__rhs);
  std::operator+(in_RSI,__rhs);
  std::operator+(in_RSI,(char *)__rhs);
  offset_abi_cxx11_(in_stack_ffffffffffffe4e8,(size_t)in_stack_ffffffffffffe4e0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe4e8,in_stack_ffffffffffffe4e0);
  std::operator+(in_RSI,(char *)__rhs);
  std::__cxx11::string::operator+=((string *)in_RDI,local_c60);
  std::__cxx11::string::~string(local_c60);
  std::__cxx11::string::~string(local_c80);
  std::__cxx11::string::~string(local_1b40);
  std::__cxx11::string::~string(local_ca0);
  std::__cxx11::string::~string(local_cc0);
  std::__cxx11::string::~string(local_ce0);
  std::__cxx11::string::~string(local_d00);
  std::__cxx11::string::~string(local_d20);
  std::__cxx11::string::~string(local_d40);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffe4e0);
  std::__cxx11::string::~string(local_d60);
  std::__cxx11::string::~string(local_d80);
  std::__cxx11::string::~string(local_1b00);
  std::__cxx11::string::~string(local_da0);
  std::__cxx11::string::~string(local_dc0);
  std::__cxx11::string::~string(local_de0);
  std::__cxx11::string::~string(local_e00);
  std::__cxx11::string::~string(local_e20);
  std::__cxx11::string::~string(local_e40);
  std::__cxx11::string::~string(local_e60);
  std::__cxx11::string::~string(local_e80);
  std::__cxx11::string::~string(local_1ae0);
  std::__cxx11::string::~string(local_ea0);
  std::__cxx11::string::~string(local_ec0);
  std::__cxx11::string::~string(local_1ac0);
  std::__cxx11::string::~string(local_ee0);
  std::__cxx11::string::~string(local_f00);
  std::__cxx11::string::~string(local_1aa0);
  std::__cxx11::string::~string(local_f20);
  std::__cxx11::string::~string(local_f40);
  std::__cxx11::string::~string(local_1a80);
  std::__cxx11::string::~string(local_f60);
  std::__cxx11::string::~string(local_f80);
  std::__cxx11::string::~string(local_1a60);
  std::__cxx11::string::~string(local_fa0);
  std::__cxx11::string::~string(local_fc0);
  std::__cxx11::string::~string(local_1a40);
  std::__cxx11::string::~string(local_fe0);
  std::__cxx11::string::~string(local_1000);
  std::__cxx11::string::~string(local_1020);
  std::__cxx11::string::~string(local_1040);
  std::__cxx11::string::~string(local_1060);
  std::__cxx11::string::~string(local_1080);
  std::__cxx11::string::~string(local_10a0);
  std::__cxx11::string::~string(local_10c0);
  std::__cxx11::string::~string(local_1a20);
  std::__cxx11::string::~string(local_10e0);
  std::__cxx11::string::~string(local_1100);
  std::__cxx11::string::~string(local_1a00);
  std::__cxx11::string::~string(local_1120);
  std::__cxx11::string::~string(local_1140);
  std::__cxx11::string::~string(local_19e0);
  std::__cxx11::string::~string(local_1160);
  std::__cxx11::string::~string(local_1180);
  std::__cxx11::string::~string(local_11a0);
  std::__cxx11::string::~string(local_11c0);
  std::__cxx11::string::~string(local_11e0);
  std::__cxx11::string::~string(local_1200);
  std::__cxx11::string::~string(local_19c0);
  std::__cxx11::string::~string(local_1220);
  std::__cxx11::string::~string(local_1240);
  std::__cxx11::string::~string(local_19a0);
  std::__cxx11::string::~string(local_1260);
  std::__cxx11::string::~string(local_1280);
  std::__cxx11::string::~string(local_12a0);
  std::__cxx11::string::~string(local_12c0);
  std::__cxx11::string::~string(local_12e0);
  std::__cxx11::string::~string(local_1300);
  std::__cxx11::string::~string(local_1320);
  std::__cxx11::string::~string(local_1340);
  std::__cxx11::string::~string(local_1360);
  std::__cxx11::string::~string(local_1380);
  std::__cxx11::string::~string(local_13a0);
  std::__cxx11::string::~string(local_13c0);
  std::__cxx11::string::~string(local_13e0);
  std::__cxx11::string::~string(local_1400);
  std::__cxx11::string::~string(local_1420);
  std::__cxx11::string::~string(local_1980);
  std::__cxx11::string::~string(local_1440);
  std::__cxx11::string::~string(local_1460);
  std::__cxx11::string::~string(local_1960);
  std::__cxx11::string::~string(local_1480);
  std::__cxx11::string::~string(local_14a0);
  std::__cxx11::string::~string(local_1940);
  std::__cxx11::string::~string(local_14c0);
  std::__cxx11::string::~string(local_14e0);
  std::__cxx11::string::~string(local_1920);
  std::__cxx11::string::~string(local_1500);
  std::__cxx11::string::~string(local_1520);
  std::__cxx11::string::~string(local_1540);
  std::__cxx11::string::~string(local_1560);
  std::__cxx11::string::~string(local_1580);
  std::__cxx11::string::~string(local_15a0);
  std::__cxx11::string::~string(local_15c0);
  std::__cxx11::string::~string(local_15e0);
  std::__cxx11::string::~string(local_1600);
  std::__cxx11::string::~string(local_1620);
  std::__cxx11::string::~string(local_1640);
  std::__cxx11::string::~string(local_1900);
  std::__cxx11::string::~string(local_1660);
  std::__cxx11::string::~string(local_1680);
  std::__cxx11::string::~string(local_18e0);
  std::__cxx11::string::~string(local_16a0);
  std::__cxx11::string::~string(local_16c0);
  std::__cxx11::string::~string(local_18c0);
  std::__cxx11::string::~string(local_16e0);
  std::__cxx11::string::~string(local_1700);
  std::__cxx11::string::~string(local_1720);
  std::__cxx11::string::~string(local_1740);
  std::__cxx11::string::~string(local_1760);
  std::__cxx11::string::~string(local_1780);
  std::__cxx11::string::~string(local_17a0);
  std::__cxx11::string::~string(local_17c0);
  std::__cxx11::string::~string(local_17e0);
  std::__cxx11::string::~string(local_1800);
  std::__cxx11::string::~string(local_1820);
  std::__cxx11::string::~string(local_1840);
  std::__cxx11::string::~string(local_18a0);
  std::__cxx11::string::~string(local_1860);
  std::__cxx11::string::~string(local_1880);
  local_9d = 1;
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  return __rhs;
}

Assistant:

std::string CppGenerator::genFindUpperBound(const std::string& rel_name,
                                            const std::string& attrName,
                                            size_t depth, bool parallel)
{
    const std::string depthString = std::to_string(depth);
    const std::string upperPointer = getUpperPointer(rel_name,depth,parallel);
    
    std::string returnString = offset(6+depth)+"min_"+attrName+" = "+
        rel_name+"[lowerptr_"+rel_name+"["+depthString+"]]."+attrName +";\n"+
        offset(6+depth)+"size_t leap = 1;\n"+
        offset(6+depth)+"while (min_"+attrName+" < max_"+attrName+" && "+
        "lowerptr_"+rel_name+"["+depthString+"] <= "+upperPointer+")\n"+
        offset(6+depth)+"{\n"+
        offset(7+depth)+"lowerptr_"+rel_name+"["+depthString+"] += leap;\n"+
        offset(7+depth)+"leap *= 2;\n"+
        offset(7+depth)+"if(lowerptr_"+rel_name+"["+depthString+
        "] < "+upperPointer+")\n"+offset(7+depth)+"{\n"+
        offset(8+depth)+"min_"+attrName+" = "+rel_name+"[lowerptr_"+rel_name+"["+
        depthString+"]]."+attrName+";\n"+
        offset(7+depth)+"}\n"+offset(7+depth)+"else\n"+offset(7+depth)+"{\n"+
        offset(8+depth)+"lowerptr_"+rel_name+"["+depthString+"] = "+upperPointer+";\n"+
        offset(8+depth)+"break;\n"+
        offset(7+depth)+"}\n"+
        offset(6+depth)+"}\n";

    /*
     * When we found an upper bound; to find the least upper bound;
     * use binary search to backtrack.
     */ 
    returnString += offset(6+depth)+"/* Backtrack with binary search */\n"+
        offset(6+depth)+"if (leap > 2 && max_"+attrName+" <= "+rel_name+
        "[lowerptr_"+rel_name+"["+depthString+"]]."+attrName+")\n"+offset(6+depth)+"{\n"+
        offset(7+depth)+"leap /= 2;\n"+
        offset(7+depth)+"size_t high = lowerptr_"+rel_name+"["+depthString+"], low = "+
        "lowerptr_"+rel_name+"["+depthString+"] - leap, mid = 0;\n"+
        offset(7+depth)+"while (high > low && high != low)\n"+offset(7+depth)+"{\n"+
        offset(8+depth)+"mid = (high + low) / 2;\n"+
        offset(8+depth)+"if (max_"+attrName+" > "+rel_name+"[mid - 1]."+attrName+" && "+
        "max_"+attrName+" <= "+rel_name+"[mid]."+attrName+")\n"+offset(8+depth)+"{\n"+
        offset(9+depth)+"lowerptr_"+rel_name+"["+depthString+"] = mid;\n"+
        offset(9+depth)+"break;\n"+offset(8+depth)+"}\n"+
        offset(8+depth)+"else if (max_"+attrName+" <= "+rel_name+"[mid]."+attrName+")\n"+
        offset(9+depth)+"high = mid - 1;\n"+
        offset(8+depth)+"else \n"+offset(9+depth)+"low = mid + 1;\n"+
        offset(7+depth)+"}\n"+
        offset(7+depth)+"mid = (high + low) / 2;\n"+
        offset(7+depth)+"if ("+rel_name+"[mid-1]."+attrName+" >= max_"+attrName+")\n"+
        offset(8+depth)+"mid -= 1;\n"+
        offset(7+depth)+"lowerptr_"+rel_name+"["+depthString+"] = mid;\n"+
        offset(6+depth)+"}\n";

    return returnString;
}